

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *stream,QJsonArray *array)

{
  tuple<QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_> tVar1;
  long in_FS_OFFSET;
  QJsonDocument doc;
  __uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> local_30;
  QJsonDocument local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d._M_t.
  super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
       (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QJsonDocument::QJsonDocument(&local_28);
  operator>>(stream,&local_28);
  QJsonDocument::array((QJsonDocument *)&local_30);
  tVar1.super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)
       (array->a).d.ptr;
  (array->a).d.ptr =
       (QCborContainerPrivate *)
       local_30._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  local_30._M_t.
  super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
       (tuple<QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)
       (tuple<QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)
       tVar1.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  QJsonArray::~QJsonArray((QJsonArray *)&local_30);
  QJsonDocument::~QJsonDocument(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QJsonArray &array)
{
    QJsonDocument doc;
    stream >> doc;
    array = doc.array();
    return stream;
}